

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

string * __thiscall
leveldb::DecompressAllocator::get_abi_cxx11_
          (string *__return_storage_ptr__,DecompressAllocator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::mutex::lock(&this->mutex);
  if (*(long *)&this->stack != *(long *)&this->field_0x38) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(*(long *)&this->field_0x38 + -0x20));
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&this->stack);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return __return_storage_ptr__;
}

Assistant:

std::string DecompressAllocator::get() {
  std::string buffer;
  std::lock_guard<std::mutex> lock(mutex);

  if (!stack.empty()) {
    buffer = std::move(stack.back());
    buffer.clear();
    stack.pop_back();
  }
  return buffer;
}